

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IOCommunicationsNode::Decode(IOCommunicationsNode *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  IOCommunicationsNode *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 6) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  StandardVariable::Decode(&this->super_StandardVariable,local_18);
  pKVar2 = KDataStream::operator>>(local_18,&(this->super_StandardVariable).field_0xe);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_StandardVariable).field_0xf);
  operator>>(pKVar2,(DataTypeBase *)&this->m_CommID);
  return;
}

Assistant:

void IOCommunicationsNode::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < STANDARD_VARIABLE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    StandardVariable::Decode( stream );

    stream >> m_ui8CommNodeTyp
           >> m_ui8Padding
           >> KDIS_STREAM m_CommID;
}